

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy-stubs-internal.h
# Opt level: O2

char * duckdb_snappy::Varint::Parse32WithLimit(char *p,char *l,uint32_t *OUTPUT)

{
  uint uVar1;
  uchar *ptr;
  char *pcVar2;
  
  if (l <= p) {
    return (char *)0x0;
  }
  pcVar2 = p + 1;
  uVar1 = (byte)*p & 0x7f;
  if (*p < '\0') {
    if (l <= pcVar2) {
      return (char *)0x0;
    }
    pcVar2 = p + 2;
    uVar1 = uVar1 | ((byte)p[1] & 0x7f) << 7;
    if (p[1] < '\0') {
      if (l <= pcVar2) {
        return (char *)0x0;
      }
      pcVar2 = p + 3;
      uVar1 = uVar1 | ((byte)p[2] & 0x7f) << 0xe;
      if (p[2] < '\0') {
        if (l <= pcVar2) {
          return (char *)0x0;
        }
        pcVar2 = p + 4;
        uVar1 = uVar1 | ((byte)p[3] & 0x7f) << 0x15;
        if (p[3] < '\0') {
          if (l <= pcVar2) {
            return (char *)0x0;
          }
          if (0xf < (byte)p[4]) {
            return (char *)0x0;
          }
          pcVar2 = p + 5;
          uVar1 = uVar1 | (uint)(byte)p[4] << 0x1c;
        }
      }
    }
  }
  *OUTPUT = uVar1;
  return pcVar2;
}

Assistant:

inline const char* Varint::Parse32WithLimit(const char* p,
                                            const char* l,
                                            uint32_t* OUTPUT) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* limit = reinterpret_cast<const unsigned char*>(l);
  uint32_t b, result;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result = b & 127;          if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) <<  7; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 14; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 21; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 28; if (b < 16) goto done;
  return NULL;       // Value is too long to be a varint32
 done:
  *OUTPUT = result;
  return reinterpret_cast<const char*>(ptr);
}